

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationSection.cxx
# Opt level: O2

void __thiscall cmDocumentationSection::Prepend(cmDocumentationSection *this,char *(*data) [2])

{
  char **__args_1;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> tmp;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> local_38;
  
  local_38.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (cmDocumentationEntry *)0x0;
  local_38.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (cmDocumentationEntry *)0x0;
  local_38.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (__args_1 = *data + 1; *__args_1 != (char *)0x0; __args_1 = __args_1 + 2) {
    std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>::
    emplace_back<char_const*&,char_const*&>
              ((vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>> *)&local_38,
               (char **)(__args_1 + -1),__args_1);
  }
  std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>::
  insert<__gnu_cxx::__normal_iterator<cmDocumentationEntry*,std::vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>>>,void>
            ((vector<cmDocumentationEntry,std::allocator<cmDocumentationEntry>> *)&this->Entries,
             (this->Entries).
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
             .super__Vector_impl_data._M_start,
             (__normal_iterator<cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
              )local_38.
               super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<cmDocumentationEntry_*,_std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>_>
              )local_38.
               super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector(&local_38);
  return;
}

Assistant:

void cmDocumentationSection::Prepend(const char* data[][2])
{
  std::vector<cmDocumentationEntry> tmp;
  int i = 0;
  while (data[i][1]) {
    tmp.emplace_back(data[i][0], data[i][1]);
    data += 1;
  }
  this->Entries.insert(this->Entries.begin(), tmp.begin(), tmp.end());
}